

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O0

void compute_response_layer_switch_Dyy_unconditional_opt_naive
               (response_layer *layer,integral_image *iimage)

{
  long in_RSI;
  int *in_RDI;
  int filter_size;
  int iheight;
  integral_image *in_stack_00000048;
  response_layer *in_stack_00000050;
  integral_image *in_stack_00000208;
  response_layer *in_stack_00000210;
  
  if (*(int *)(in_RSI + 4) < *in_RDI) {
    compute_response_layer_unconditional(in_stack_00000050,in_stack_00000048);
  }
  else {
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (in_stack_00000210,in_stack_00000208);
  }
  return;
}

Assistant:

void compute_response_layer_switch_Dyy_unconditional_opt_naive(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer_switch_Dyy_unconditional_opt

        optimization:
        - uses compute_response_layer_unconditional for all corner-cases for 32x32, 64x64 image

        notes:
        - intended to check if our corner case optimizations are better or not
    */

    int iheight = iimage->height;
    int filter_size = layer->filter_size;

    // 1. Case The filter is smaller than the image
    if (filter_size <= iheight) {
        // Split the image into 9 cases - corners, borders and middle part.
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

    } else {
        compute_response_layer_unconditional(layer, iimage);
    }
}